

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_statistics.h
# Opt level: O0

float highwayhash::Median<float>(vector<float,_std::allocator<float>_> *samples)

{
  float fVar1;
  bool bVar2;
  iterator __first;
  iterator __last;
  size_type sVar3;
  ulong __n;
  reference pvVar4;
  size_t half;
  vector<float,_std::allocator<float>_> *samples_local;
  
  bVar2 = std::vector<float,_std::allocator<float>_>::empty(samples);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!samples->empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]highwayhash/highwayhash/robust_statistics.h"
                  ,0x6e,"T highwayhash::Median(std::vector<T> *) [T = float]");
  }
  __first = std::vector<float,_std::allocator<float>_>::begin(samples);
  __last = std::vector<float,_std::allocator<float>_>::end(samples);
  std::sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
            ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             __first._M_current,
             (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             __last._M_current);
  sVar3 = std::vector<float,_std::allocator<float>_>::size(samples);
  __n = sVar3 >> 1;
  sVar3 = std::vector<float,_std::allocator<float>_>::size(samples);
  if ((sVar3 & 1) == 0) {
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](samples,__n);
    fVar1 = *pvVar4;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](samples,__n - 1);
    samples_local._4_4_ = (fVar1 + *pvVar4) / 2.0;
  }
  else {
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](samples,__n);
    samples_local._4_4_ = *pvVar4;
  }
  return samples_local._4_4_;
}

Assistant:

T Median(std::vector<T>* samples) {
  assert(!samples->empty());
  std::sort(samples->begin(), samples->end());
  const size_t half = samples->size() / 2;
  // Odd count: return middle
  if (samples->size() % 2) {
    return (*samples)[half];
  }
  // Even count: return average of middle two.
  return ((*samples)[half] + (*samples)[half - 1]) / 2;
}